

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

DDSInfo * __thiscall DDSInfo::PrintD3DFormatFlagNames_abi_cxx11_(DDSInfo *this,uint flags)

{
  pointer ppVar1;
  key_type local_954;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948 [36];
  key_type local_924;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918 [36];
  key_type local_8f4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8 [36];
  key_type local_8c4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8 [36];
  key_type local_894;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888 [36];
  key_type local_864;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858 [36];
  key_type local_834;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828 [36];
  key_type local_804;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8 [36];
  key_type local_7d4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [36];
  key_type local_7a4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798 [36];
  key_type local_774;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768 [36];
  key_type local_744;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738 [36];
  key_type local_714;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708 [36];
  key_type local_6e4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8 [36];
  key_type local_6b4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8 [36];
  key_type local_684;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678 [36];
  key_type local_654;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648 [36];
  key_type local_624;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618 [36];
  key_type local_5f4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8 [36];
  key_type local_5c4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8 [36];
  key_type local_594;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [36];
  key_type local_564;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [36];
  key_type local_534;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [36];
  key_type local_504;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8 [36];
  key_type local_4d4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8 [36];
  key_type local_4a4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [36];
  key_type local_474;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [36];
  key_type local_444;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [36];
  key_type local_414;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [36];
  key_type local_3e4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [36];
  key_type local_3b4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8 [36];
  key_type local_384;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378 [36];
  key_type local_354;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348 [36];
  key_type local_324;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [36];
  key_type local_2f4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [36];
  key_type local_2c4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8 [36];
  key_type local_294;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [36];
  key_type local_264;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [36];
  key_type local_234;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [36];
  key_type local_204;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [36];
  key_type local_1d4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [36];
  key_type local_1a4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [36];
  key_type local_174;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [36];
  key_type local_144;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [36];
  key_type local_114;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [36];
  key_type local_e4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [36];
  key_type local_b4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [36];
  key_type local_84;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [99];
  undefined1 local_15;
  uint local_14;
  DDSInfo *pDStack_10;
  uint flags_local;
  string *output;
  
  local_15 = 0;
  local_14 = flags;
  pDStack_10 = this;
  std::__cxx11::string::string((string *)this);
  if ((local_14 & 0x14) != 0) {
    local_84 = 0x14;
    local_80._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_84);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_80);
    std::operator+(local_78,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_14 & 0x15) != 0) {
    local_b4 = 0x15;
    local_b0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_b4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b0);
    std::operator+(local_a8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_a8);
  }
  if ((local_14 & 0x16) != 0) {
    local_e4 = 0x16;
    local_e0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_e4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_e0);
    std::operator+(local_d8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_d8);
  }
  if ((local_14 & 0x17) != 0) {
    local_114 = 0x17;
    local_110._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_114);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_110);
    std::operator+(local_108,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_108);
  }
  if ((local_14 & 0x18) != 0) {
    local_144 = 0x18;
    local_140._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_144);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_140);
    std::operator+(local_138,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_138);
  }
  if ((local_14 & 0x19) != 0) {
    local_174 = 0x19;
    local_170._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_174);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_170);
    std::operator+(local_168,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_168);
  }
  if ((local_14 & 0x1a) != 0) {
    local_1a4 = 0x1a;
    local_1a0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_1a4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_1a0);
    std::operator+(local_198,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_198);
  }
  if ((local_14 & 0x1b) != 0) {
    local_1d4 = 0x1b;
    local_1d0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_1d4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_1d0);
    std::operator+(local_1c8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_1c8);
  }
  if ((local_14 & 0x1c) != 0) {
    local_204 = 0x1c;
    local_200._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_204);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_200);
    std::operator+(local_1f8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_1f8);
  }
  if ((local_14 & 0x1d) != 0) {
    local_234 = 0x1d;
    local_230._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_234);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_230);
    std::operator+(local_228,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_228);
  }
  if ((local_14 & 0x1e) != 0) {
    local_264 = 0x1e;
    local_260._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_264);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_260);
    std::operator+(local_258,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_258);
  }
  if ((local_14 & 0x1f) != 0) {
    local_294 = 0x1f;
    local_290._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_294);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_290);
    std::operator+(local_288,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_288);
  }
  if ((local_14 & 0x20) != 0) {
    local_2c4 = 0x20;
    local_2c0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_2c4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_2c0);
    std::operator+(local_2b8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_2b8);
  }
  if ((local_14 & 0x21) != 0) {
    local_2f4 = 0x21;
    local_2f0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_2f4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_2f0);
    std::operator+(local_2e8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_2e8);
  }
  if ((local_14 & 0x22) != 0) {
    local_324 = 0x22;
    local_320._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_324);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_320);
    std::operator+(local_318,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_318);
  }
  if ((local_14 & 0x23) != 0) {
    local_354 = 0x23;
    local_350._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_354);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_350);
    std::operator+(local_348,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_348);
  }
  if ((local_14 & 0x24) != 0) {
    local_384 = 0x24;
    local_380._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_384);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_380);
    std::operator+(local_378,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_378);
  }
  if ((local_14 & 0x28) != 0) {
    local_3b4 = 0x28;
    local_3b0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_3b4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_3b0);
    std::operator+(local_3a8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_3a8);
  }
  if ((local_14 & 0x29) != 0) {
    local_3e4 = 0x29;
    local_3e0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_3e4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_3e0);
    std::operator+(local_3d8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_3d8);
  }
  if ((local_14 & 0x32) != 0) {
    local_414 = 0x32;
    local_410._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_414);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_410);
    std::operator+(local_408,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_408);
  }
  if ((local_14 & 0x33) != 0) {
    local_444 = 0x33;
    local_440._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_444);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_440);
    std::operator+(local_438,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_438);
  }
  if ((local_14 & 0x34) != 0) {
    local_474 = 0x34;
    local_470._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_474);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_470);
    std::operator+(local_468,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_468);
  }
  if ((local_14 & 0x3c) != 0) {
    local_4a4 = 0x3c;
    local_4a0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_4a4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_4a0);
    std::operator+(local_498,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_498);
  }
  if ((local_14 & 0x3d) != 0) {
    local_4d4 = 0x3d;
    local_4d0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_4d4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_4d0);
    std::operator+(local_4c8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_4c8);
  }
  if ((local_14 & 0x3e) != 0) {
    local_504 = 0x3e;
    local_500._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_504);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_500);
    std::operator+(local_4f8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_4f8);
  }
  if ((local_14 & 0x3f) != 0) {
    local_534 = 0x3f;
    local_530._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_534);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_530);
    std::operator+(local_528,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_528);
  }
  if ((local_14 & 0x40) != 0) {
    local_564 = 0x40;
    local_560._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_564);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_560);
    std::operator+(local_558,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_558);
  }
  if ((local_14 & 0x43) != 0) {
    local_594 = 0x43;
    local_590._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_594);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_590);
    std::operator+(local_588,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_588);
  }
  if ((local_14 & 0x51) != 0) {
    local_5c4 = 0x51;
    local_5c0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_5c4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_5c0);
    std::operator+(local_5b8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_5b8);
  }
  if ((local_14 & 0x6e) != 0) {
    local_5f4 = 0x6e;
    local_5f0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_5f4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_5f0);
    std::operator+(local_5e8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_5e8);
  }
  if ((local_14 & 0x6f) != 0) {
    local_624 = 0x6f;
    local_620._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_624);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_620);
    std::operator+(local_618,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_618);
  }
  if ((local_14 & 0x70) != 0) {
    local_654 = 0x70;
    local_650._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_654);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_650);
    std::operator+(local_648,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_648);
  }
  if ((local_14 & 0x71) != 0) {
    local_684 = 0x71;
    local_680._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_684);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_680);
    std::operator+(local_678,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_678);
  }
  if ((local_14 & 0x72) != 0) {
    local_6b4 = 0x72;
    local_6b0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_6b4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_6b0);
    std::operator+(local_6a8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_6a8);
  }
  if ((local_14 & 0x73) != 0) {
    local_6e4 = 0x73;
    local_6e0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_6e4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_6e0);
    std::operator+(local_6d8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_6d8);
  }
  if ((local_14 & 0x74) != 0) {
    local_714 = 0x74;
    local_710._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_714);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_710);
    std::operator+(local_708,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_708);
  }
  if ((local_14 & 0x59565955) != 0) {
    local_744 = 0x59565955;
    local_740._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_744);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_740);
    std::operator+(local_738,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_738);
  }
  if ((local_14 & 0x47424752) != 0) {
    local_774 = 0x47424752;
    local_770._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_774);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_770);
    std::operator+(local_768,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_768);
  }
  if ((local_14 & 0x32595559) != 0) {
    local_7a4 = 0x32595559;
    local_7a0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_7a4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_7a0);
    std::operator+(local_798,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_798);
  }
  if ((local_14 & 0x42475247) != 0) {
    local_7d4 = 0x42475247;
    local_7d0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_7d4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_7d0);
    std::operator+(local_7c8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_7c8);
  }
  if ((local_14 & 0x31545844) != 0) {
    local_804 = 0x31545844;
    local_800._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_804);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_800);
    std::operator+(local_7f8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_7f8);
  }
  if ((local_14 & 0x32545844) != 0) {
    local_834 = 0x32545844;
    local_830._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_834);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_830);
    std::operator+(local_828,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_828);
  }
  if ((local_14 & 0x33545844) != 0) {
    local_864 = 0x33545844;
    local_860._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_864);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_860);
    std::operator+(local_858,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_858);
  }
  if ((local_14 & 0x34545844) != 0) {
    local_894 = 0x34545844;
    local_890._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_894);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_890);
    std::operator+(local_888,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_888);
  }
  if ((local_14 & 0x35545844) != 0) {
    local_8c4 = 0x35545844;
    local_8c0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_8c4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_8c0);
    std::operator+(local_8b8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_8b8);
  }
  if ((local_14 & 0x32435450) != 0) {
    local_8f4 = 0x32435450;
    local_8f0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_8f4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_8f0);
    std::operator+(local_8e8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_8e8);
  }
  if ((local_14 & 0x34435450) != 0) {
    local_924 = 0x34435450;
    local_920._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_924);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_920);
    std::operator+(local_918,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_918);
  }
  if ((local_14 & 0x7fffffff) != 0) {
    local_954 = 0x7fffffff;
    local_950._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)d3d_format_names_abi_cxx11_,&local_954);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_950);
    std::operator+(local_948,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_948);
  }
  RemoveTrailingCharacter((string *)this,'|');
  return this;
}

Assistant:

std::string PrintD3DFormatFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,d3d_format_names)
    #include "defs/dds/d3d_formats.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }